

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DFAContentModel::DFAContentModel
          (DFAContentModel *this,bool dtd,ContentSpecNode *elemContentSpec,MemoryManager *manager)

{
  OutOfMemoryException *anon_var_0;
  MemoryManager *manager_local;
  ContentSpecNode *elemContentSpec_local;
  bool dtd_local;
  DFAContentModel *this_local;
  
  XMLContentModel::XMLContentModel(&this->super_XMLContentModel);
  (this->super_XMLContentModel)._vptr_XMLContentModel = (_func_int **)&PTR__DFAContentModel_00533b08
  ;
  this->fElemMap = (QName **)0x0;
  this->fElemMapType = (NodeTypes *)0x0;
  this->fElemMapSize = 0;
  this->fEmptyOk = false;
  this->fEOCPos = 0;
  this->fFinalStateFlags = (bool *)0x0;
  this->fFollowList = (CMStateSet **)0x0;
  this->fHeadNode = (CMNode *)0x0;
  this->fLeafCount = 0;
  this->fLeafList = (CMLeaf **)0x0;
  this->fLeafListType = (NodeTypes *)0x0;
  this->fTransTable = (uint **)0x0;
  this->fTransTableSize = 0;
  this->fCountingStates = (Occurence **)0x0;
  this->fDTD = dtd;
  this->fIsMixed = false;
  this->fLeafNameTypeVector = (ContentLeafNameTypeVector *)0x0;
  this->fMemoryManager = manager;
  buildDFA(this,elemContentSpec);
  return;
}

Assistant:

DFAContentModel::DFAContentModel( const bool             dtd
                                , ContentSpecNode* const elemContentSpec
                                , MemoryManager* const   manager) :

    fElemMap(0)
    , fElemMapType(0)
    , fElemMapSize(0)
    , fEmptyOk(false)
    , fEOCPos(0)
    , fFinalStateFlags(0)
    , fFollowList(0)
    , fHeadNode(0)
    , fLeafCount(0)
    , fLeafList(0)
    , fLeafListType(0)
    , fTransTable(0)
    , fTransTableSize(0)
    , fCountingStates(0)
    , fDTD(dtd)
    , fIsMixed(false)
    , fLeafNameTypeVector(0)
    , fMemoryManager(manager)
{
    // And build the DFA data structures
    try
    {
        buildDFA(elemContentSpec);
    }
    catch( const OutOfMemoryException& )
    {
        cleanup();
        throw;
    }
}